

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

int find_ffofs(BuildCtx *ctx,char *name)

{
  char *pcVar1;
  int iVar2;
  char *gl;
  int i;
  char *name_local;
  BuildCtx *ctx_local;
  
  gl._4_4_ = 0;
  do {
    if (ctx->nglob <= gl._4_4_) {
      fprintf(_stderr,"Error: undefined fast function %s%s\n","lj_ff_",name);
      exit(1);
    }
    pcVar1 = ctx->globnames[gl._4_4_];
    if (((*pcVar1 == 'f') && (pcVar1[1] == 'f')) && (pcVar1[2] == '_')) {
      iVar2 = strcmp(pcVar1 + 3,name);
      if (iVar2 == 0) {
        return (int)ctx->glob[gl._4_4_] - (int)ctx->code;
      }
    }
    gl._4_4_ = gl._4_4_ + 1;
  } while( true );
}

Assistant:

static int find_ffofs(BuildCtx *ctx, const char *name)
{
  int i;
  for (i = 0; i < ctx->nglob; i++) {
    const char *gl = ctx->globnames[i];
    if (gl[0] == 'f' && gl[1] == 'f' && gl[2] == '_' && !strcmp(gl+3, name)) {
      return (int)((uint8_t *)ctx->glob[i] - ctx->code);
    }
  }
  fprintf(stderr, "Error: undefined fast function %s%s\n",
	  LABEL_PREFIX_FF, name);
  exit(1);
}